

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsServer.h
# Opt level: O0

void __thiscall Scs::Server::ClientConnection::ClientConnection(ClientConnection *this,Server *svr)

{
  Server *svr_local;
  ClientConnection *this_local;
  
  this->server = svr;
  std::thread::thread(&this->thread);
  std::shared_ptr<Scs::Socket>::shared_ptr(&this->socket);
  this->clientID = -1;
  this->connected = false;
  SendQueue::SendQueue(&this->sendQueue);
  ReceiveQueue::ReceiveQueue(&this->receiveQueue);
  return;
}

Assistant:

ClientConnection(const Server & svr) :
				server(svr),
				clientID(-1),
				connected(false)
				{}